

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int32 ngram_ng_score(ngram_model_t *model,int32 wid,int32 *history,int32 n_hist,int32 *n_used)

{
  ngram_class_t *lmclass;
  int32 iVar1;
  int32 iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (wid == -1) {
LAB_00105257:
    iVar3 = model->log_zero;
  }
  else {
    uVar5 = 0;
    if (wid < 0) {
      lmclass = *(ngram_class_t **)((long)model->classes + (ulong)((uint)wid >> 0x15 & 0x3f8));
      iVar1 = ngram_class_prob(lmclass,wid);
      if (iVar1 == 1) goto LAB_00105257;
      wid = lmclass->tag_wid;
    }
    else {
      iVar1 = 0;
    }
    uVar4 = 0;
    if (0 < n_hist) {
      uVar4 = (ulong)(uint)n_hist;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      if (history[uVar5] < -1) {
        history[uVar5] =
             **(int32 **)((long)model->classes + (ulong)((uint)history[uVar5] >> 0x15 & 0x3f8));
      }
    }
    iVar2 = (*model->funcs->score)(model,wid,history,n_hist,n_used);
    iVar3 = iVar2 + iVar1;
  }
  return iVar3;
}

Assistant:

int32
ngram_ng_score(ngram_model_t * model, int32 wid, int32 * history,
               int32 n_hist, int32 * n_used)
{
    int32 score, class_weight = 0;
    int i;

    /* Closed vocabulary, OOV word probability is zero */
    if (wid == NGRAM_INVALID_WID)
        return model->log_zero;

    /* "Declassify" wid and history */
    if (NGRAM_IS_CLASSWID(wid)) {
        ngram_class_t *lmclass = model->classes[NGRAM_CLASSID(wid)];

        class_weight = ngram_class_prob(lmclass, wid);
        if (class_weight == 1)  /* Meaning, not found in class. */
            return model->log_zero;
        wid = lmclass->tag_wid;
    }
    for (i = 0; i < n_hist; ++i) {
        if (history[i] != NGRAM_INVALID_WID
            && NGRAM_IS_CLASSWID(history[i]))
            history[i] =
                model->classes[NGRAM_CLASSID(history[i])]->tag_wid;
    }
    score = (*model->funcs->score) (model, wid, history, n_hist, n_used);

    /* Multiply by unigram in-class weight. */
    return score + class_weight;
}